

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

char * qcc_arena_vsprintf(qcc_arena *arena,char *fmt,__va_list_tag *args)

{
  uint8_t *__s;
  uint uVar1;
  size_t sVar2;
  undefined8 uStack_48;
  uint len;
  va_list tmp;
  char *str;
  __va_list_tag *args_local;
  char *fmt_local;
  qcc_arena *arena_local;
  
  __s = arena->free_memory;
  tmp[0].overflow_arg_area = args->reg_save_area;
  uStack_48._0_4_ = args->gp_offset;
  uStack_48._4_4_ = args->fp_offset;
  tmp[0]._0_8_ = args->overflow_arg_area;
  tmp[0].reg_save_area = __s;
  sVar2 = qcc_arena_memory_available(arena);
  uVar1 = vsnprintf((char *)__s,sVar2,fmt,&uStack_48);
  sVar2 = qcc_arena_memory_available(arena);
  if (uVar1 < sVar2) {
    arena->free_memory = arena->free_memory + (uVar1 + 1);
    arena_local = (qcc_arena *)tmp[0].reg_save_area;
  }
  else {
    arena_local = (qcc_arena *)0x0;
  }
  return (char *)arena_local;
}

Assistant:

const char *qcc_arena_vsprintf(struct qcc_arena *arena, const char *fmt,
                               va_list args)
{
    char *str = (char *)arena->free_memory;

    va_list tmp;
    va_copy(tmp, args);
    unsigned len = vsnprintf(str, qcc_arena_memory_available(arena), fmt, tmp);
    va_end(tmp);

    if (len < qcc_arena_memory_available(arena))
    {
        arena->free_memory += len + 1;
        return str;
    }

    return 0;
}